

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  long lVar1;
  HTTP *pHVar2;
  stream_ctx *psVar3;
  undefined8 *puVar4;
  RTSP *pRVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  CURLUcode CVar11;
  int iVar12;
  CURLcode CVar13;
  CURLMcode CVar14;
  Curl_easy *data;
  size_t sVar15;
  CURL_conflict *data_00;
  FILEPROTO *pFVar16;
  CURLU *u;
  char *pcVar17;
  uint stream_id;
  Curl_easy *data_01;
  ulong uVar18;
  Curl_easy *second;
  undefined1 (*local_150) [16];
  stream_ctx *newstream;
  stream_ctx *local_140;
  char buffer [256];
  
  lVar1 = *(long *)((long)userp + 0x10);
  data_01 = *(Curl_easy **)(lVar1 + 0x10);
  stream_id = (frame->hd).stream_id;
  if (((data_01 != (Curl_easy *)0x0) && (((data_01->set).field_0x8bd & 0x10) != 0)) &&
     (0 < *(int *)(*userp + 0xc))) {
    iVar7 = fr_print(frame,buffer,(size_t)userp);
    buffer[iVar7] = '\0';
    if ((((data_01->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[%d] <- %s",
                        (ulong)(uint)(frame->hd).stream_id,buffer);
    }
  }
  if (stream_id == 0) {
    if ((frame->hd).type == '\a') {
      *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) | 2;
      *(int32_t *)(lVar1 + 0xc0) = (frame->priority).pri_spec.weight;
      *(int32_t *)(lVar1 + 0xc4) = (frame->priority).pri_spec.stream_id;
      if (data_01 != (Curl_easy *)0x0) {
        if (((data_01->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data_01,"received GOAWAY, error=%d, last_stream=%u");
        }
        Curl_multi_connchanged(data_01->multi);
        return 0;
      }
      return 0;
    }
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    if (((frame->hd).flags & 1) != 0) {
      return 0;
    }
    iVar7 = *(int *)(lVar1 + 8);
    uVar10 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)(lVar1 + 8) = uVar10;
    uVar10 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(byte *)(lVar1 + 200) = *(byte *)(lVar1 + 200) & 0xfb | (uVar10 != 0) << 2;
    if (data_01 != (Curl_easy *)0x0) {
      if (((((data_01->set).field_0x8bd & 0x10) != 0) &&
          ((*(int *)(*userp + 0xc) < 1 ||
           (Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] MAX_CONCURRENT_STREAMS: %d",
                              (ulong)*(uint *)(lVar1 + 8)), ((data_01->set).field_0x8bd & 0x10) != 0
           )))) && (0 < *(int *)(*userp + 0xc))) {
        pcVar17 = "TRUE";
        if ((*(byte *)(lVar1 + 200) & 4) == 0) {
          pcVar17 = "false";
        }
        Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] ENABLE_PUSH: %s",pcVar17);
      }
      if (iVar7 != *(int *)(lVar1 + 8)) {
        if ((((data_01->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,"[0] notify MAX_CONCURRENT_STREAMS: %u");
        }
        Curl_multi_connchanged(data_01->multi);
      }
    }
    if (((data_01->req).keepon & 0x2aU) == 2) {
      pHVar2 = (data_01->req).p.http;
      if (pHVar2 == (HTTP *)0x0) {
        return 0;
      }
      psVar3 = (stream_ctx *)pHVar2->h2_ctx;
      if (psVar3 != (stream_ctx *)0x0) {
        drain_stream((Curl_cfilter *)userp,data_01,psVar3);
        return 0;
      }
      return 0;
    }
    return 0;
  }
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    if (data_01 == (Curl_easy *)0x0) {
      return 0;
    }
    if (((data_01->set).field_0x8bd & 0x10) == 0) {
      return 0;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return 0;
    }
    pcVar17 = "[%d] No Curl_easy associated";
    iVar7 = 0;
    goto LAB_005765cc;
  }
  pHVar2 = (data->req).p.http;
  if (pHVar2 == (HTTP *)0x0) {
    stream_id = (frame->hd).stream_id;
  }
  else {
    psVar3 = (stream_ctx *)pHVar2->h2_ctx;
    stream_id = (frame->hd).stream_id;
    if (psVar3 != (stream_ctx *)0x0) {
      if (8 < (frame->hd).type) {
        return 0;
      }
      puVar4 = *(undefined8 **)((long)userp + 0x10);
      switch((frame->hd).type) {
      case '\0':
        sVar15 = Curl_bufq_len(&psVar3->recvbuf);
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          uVar8 = nghttp2_session_get_stream_effective_recv_data_length
                            ((nghttp2_session *)*puVar4,psVar3->id);
          iVar9 = nghttp2_session_get_stream_effective_local_window_size
                            ((nghttp2_session *)*puVar4,psVar3->id);
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] DATA, buffered=%zu, window=%d/%d",
                            (ulong)stream_id,sVar15,(ulong)uVar8,iVar9);
        }
        if (psVar3->bodystarted == false) {
          iVar7 = nghttp2_submit_rst_stream((nghttp2_session *)*puVar4,'\0',stream_id,1);
          iVar7 = nghttp2_is_fatal(iVar7);
          if (iVar7 != 0) {
            return -0x386;
          }
        }
        if (((frame->hd).flags & 1) == 0) {
          if (sVar15 <= psVar3->local_window_size) {
            return 0;
          }
          uVar10 = nghttp2_session_get_stream_local_window_size
                             ((nghttp2_session *)*puVar4,psVar3->id);
          if ((int)uVar10 < 1) {
            return 0;
          }
          if (uVar10 != psVar3->local_window_size) {
            nghttp2_session_set_local_window_size
                      ((nghttp2_session *)*puVar4,'\0',psVar3->id,psVar3->local_window_size);
            return 0;
          }
          return 0;
        }
        break;
      case '\x01':
        if (psVar3->bodystarted != false) {
          return 0;
        }
        if (psVar3->status_code == -1) {
          return -0x386;
        }
        if (99 < psVar3->status_code - 100U) {
          psVar3->bodystarted = true;
          psVar3->status_code = -1;
        }
        CVar13 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x76cca5,(char *)0x2,0x7826f4);
        if (CVar13 != CURLE_OK) {
          return -0x386;
        }
        if (99 < psVar3->status_code - 100U) {
          psVar3->resp_hds_complete = true;
        }
        break;
      default:
        goto switchD_005762b1_caseD_2;
      case '\x03':
        psVar3->closed = true;
        if ((frame->priority).pri_spec.stream_id != 0) {
          psVar3->reset = true;
        }
        psVar3->send_closed = true;
        break;
      case '\x05':
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] PUSH_PROMISE received");
        }
        if (data->multi->push_cb == (curl_push_callback)0x0) {
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ignore it");
          }
          goto LAB_005768d0;
        }
        data_00 = curl_easy_duphandle(data);
        second = data_00;
        if (data_00 == (CURL_conflict *)0x0) {
LAB_00576897:
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"failed to duplicate handle");
          }
        }
        else {
          pFVar16 = (FILEPROTO *)(*Curl_ccalloc)(1,0x70);
          if (pFVar16 == (FILEPROTO *)0x0) {
            Curl_close(&second);
            data_00 = second;
            if (second == (Curl_easy *)0x0) goto LAB_00576897;
          }
          else {
            (data_00->req).p.file = pFVar16;
            http2_data_setup((Curl_cfilter *)userp,data_00,&local_140);
            (data_00->state).priority.weight = (data->state).priority.weight;
          }
          buffer._0_8_ = data;
          buffer._8_8_ = frame;
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ask application");
          }
          pRVar5 = (data->req).p.rtsp;
          if ((pRVar5 == (RTSP *)0x0) ||
             (pvVar6 = (pRVar5->http_wrapper).h2_ctx, pvVar6 == (void *)0x0)) {
            Curl_failf(data,"Internal NULL stream");
          }
          else {
            second = (Curl_easy *)0x0;
            u = curl_url();
            if (u != (CURLU *)0x0) {
              pcVar17 = curl_pushheader_byname((curl_pushheaders *)buffer,":scheme");
              if ((((pcVar17 == (char *)0x0) ||
                   (CVar11 = curl_url_set(u,CURLUPART_SCHEME,pcVar17,0), CVar11 == CURLUE_OK)) &&
                  ((pcVar17 = curl_pushheader_byname((curl_pushheaders *)buffer,":authority"),
                   pcVar17 == (char *)0x0 ||
                   (CVar11 = Curl_url_set_authority(u,pcVar17,0x20), CVar11 == CURLUE_OK)))) &&
                 ((pcVar17 = curl_pushheader_byname((curl_pushheaders *)buffer,":path"),
                  pcVar17 == (char *)0x0 ||
                  (CVar11 = curl_url_set(u,CURLUPART_PATH,pcVar17,0), CVar11 == CURLUE_OK)))) {
                CVar11 = curl_url_get(u,CURLUPART_URL,(char **)&second,0);
                curl_url_cleanup(u);
                if (CVar11 == CURLUE_OK) {
                  uVar8 = *(uint *)&(data_00->state).field_0x74c;
                  if ((uVar8 >> 0x10 & 1) != 0) {
                    (*Curl_cfree)((data_00->state).url);
                    uVar8 = *(uint *)&(data_00->state).field_0x74c;
                  }
                  *(uint *)&(data_00->state).field_0x74c = uVar8 | 0x10000;
                  (data_00->state).url = (char *)second;
                  CVar13 = http2_data_setup((Curl_cfilter *)userp,data_00,&newstream);
                  if (CVar13 == CURLE_OK) {
                    Curl_set_in_callback(data,true);
                    iVar7 = (*data->multi->push_cb)
                                      (data,data_00,*(size_t *)((long)pvVar6 + 0x130),
                                       (curl_pushheaders *)buffer,data->multi->push_userp);
                    Curl_set_in_callback(data,false);
                    local_150 = (undefined1 (*) [16])((long)pvVar6 + 0x128);
                    for (uVar18 = 0; uVar18 < *(ulong *)((long)pvVar6 + 0x130); uVar18 = uVar18 + 1)
                    {
                      (*Curl_cfree)(*(void **)((long)*(void **)((long)pvVar6 + 0x128) + uVar18 * 8))
                      ;
                    }
                    (*Curl_cfree)(*(void **)((long)pvVar6 + 0x128));
                    *local_150 = (undefined1  [16])0x0;
                    if (iVar7 == 0) {
                      newstream->id = (frame->push_promise).promised_stream_id;
                      *(undefined4 *)&(data_00->req).size = 0xffffffff;
                      *(undefined4 *)((long)&(data_00->req).size + 4) = 0xffffffff;
                      *(undefined4 *)&(data_00->req).maxdownload = 0xffffffff;
                      *(undefined4 *)((long)&(data_00->req).maxdownload + 4) = 0xffffffff;
                      CVar14 = Curl_multi_add_perform
                                         (data->multi,data_00,*(connectdata **)((long)userp + 0x18))
                      ;
                      if (CVar14 == CURLM_OK) {
                        iVar7 = nghttp2_session_set_stream_user_data
                                          ((nghttp2_session *)*puVar4,newstream->id,data_00);
                        if (iVar7 == 0) {
                          return 0;
                        }
                        if (((data->set).field_0x8bd & 0x10) != 0) {
                          Curl_infof(data,"failed to set user_data for stream %u",
                                     (ulong)(uint)newstream->id);
                        }
                        goto LAB_005768d0;
                      }
                      if (((data->set).field_0x8bd & 0x10) != 0) {
                        Curl_infof(data,"failed to add handle to multi");
                      }
                    }
                  }
                  else {
                    Curl_failf(data,"error setting up stream: %d",(ulong)CVar13);
                  }
                }
              }
              else {
                curl_url_cleanup(u);
              }
            }
          }
          discard_newhandle((Curl_cfilter *)userp,data_00);
        }
LAB_005768d0:
        iVar7 = nghttp2_submit_rst_stream
                          ((nghttp2_session *)*puVar4,'\0',(frame->push_promise).promised_stream_id,
                           8);
        iVar12 = nghttp2_is_fatal(iVar7);
        if (iVar12 == 0) {
          if (iVar7 != 2) {
            return 0;
          }
          if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] fail in PUSH_PROMISE received",
                              (ulong)stream_id);
          }
        }
        return -0x386;
      case '\b':
        if (((data->req).keepon & 0x2aU) != 2) {
          return 0;
        }
      }
      drain_stream((Curl_cfilter *)userp,data,psVar3);
switchD_005762b1_caseD_2:
      return 0;
    }
  }
  iVar7 = -0x386;
  if (((data->set).field_0x8bd & 0x10) == 0) {
    return -0x386;
  }
  if (*(int *)(*userp + 0xc) < 1) {
    return -0x386;
  }
  pcVar17 = "[%d] No stream_ctx set";
  data_01 = data;
LAB_005765cc:
  Curl_trc_cf_infof(data_01,(Curl_cfilter *)userp,pcVar17,(ulong)stream_id);
  return iVar7;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf), *data_s;
  int32_t stream_id = frame->hd.stream_id;

  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS: {
      if(!(frame->hd.flags & NGHTTP2_FLAG_ACK)) {
        uint32_t max_conn = ctx->max_concurrent_streams;
        ctx->max_concurrent_streams = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
        ctx->enable_push = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_ENABLE_PUSH) != 0;
        CURL_TRC_CF(data, cf, "[0] MAX_CONCURRENT_STREAMS: %d",
                    ctx->max_concurrent_streams);
        CURL_TRC_CF(data, cf, "[0] ENABLE_PUSH: %s",
                    ctx->enable_push ? "TRUE" : "false");
        if(data && max_conn != ctx->max_concurrent_streams) {
          /* only signal change if the value actually changed */
          CURL_TRC_CF(data, cf, "[0] notify MAX_CONCURRENT_STREAMS: %u",
                      ctx->max_concurrent_streams);
          Curl_multi_connchanged(data->multi);
        }
        /* Since the initial stream window is 64K, a request might be on HOLD,
         * due to exhaustion. The (initial) SETTINGS may announce a much larger
         * window and *assume* that we treat this like a WINDOW_UPDATE. Some
         * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
         * To be safe, we UNHOLD a stream in order not to stall. */
        if(CURL_WANT_SEND(data)) {
          struct stream_ctx *stream = H2_STREAM_CTX(data);
          if(stream)
            drain_stream(cf, data, stream);
        }
      }
      break;
    }
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      ctx->goaway_error = frame->goaway.error_code;
      ctx->last_stream_id = frame->goaway.last_stream_id;
      if(data) {
        infof(data, "received GOAWAY, error=%d, last_stream=%u",
                    ctx->goaway_error, ctx->last_stream_id);
        Curl_multi_connchanged(data->multi);
      }
      break;
    default:
      break;
    }
    return 0;
  }

  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    CURL_TRC_CF(data, cf, "[%d] No Curl_easy associated", stream_id);
    return 0;
  }

  return on_stream_frame(cf, data_s, frame)? NGHTTP2_ERR_CALLBACK_FAILURE : 0;
}